

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5dc644::cmLBDepend::AddDependency
          (cmLBDepend *this,cmDependInformation *info,string *file)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  _Base_ptr p_Var3;
  cmDependInformation *info_00;
  _Base_ptr *pp_Var4;
  _Rb_tree_node_base *p_Var5;
  _Alloc_node __an;
  bool bVar6;
  _Base_ptr p_Var7;
  
  info_00 = GetDependInformation(this,file,&info->PathOnly);
  GenerateDependInformation(this,info_00);
  if (info_00 == info) {
    return;
  }
  p_Var1 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  bVar6 = true;
  pp_Var4 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  while (p_Var3 = *pp_Var4, p_Var3 != (_Base_ptr)0x0) {
    bVar6 = info_00 < *(cmDependInformation **)(p_Var3 + 1);
    p_Var7 = p_Var3;
    pp_Var4 = &p_Var3->_M_left + (*(cmDependInformation **)(p_Var3 + 1) <= info_00);
  }
  p_Var5 = p_Var7;
  if (bVar6) {
    if (p_Var7 == (info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_001f4da8;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var7);
  }
  if (info_00 <= *(cmDependInformation **)(p_Var5 + 1)) {
    return;
  }
LAB_001f4da8:
  if (p_Var1 == (_Rb_tree_header *)p_Var7) {
    bVar6 = true;
  }
  else {
    bVar6 = info_00 < *(cmDependInformation **)(p_Var7 + 1);
  }
  p_Var5 = (_Rb_tree_node_base *)operator_new(0x28);
  *(cmDependInformation **)(p_Var5 + 1) = info_00;
  std::_Rb_tree_insert_and_rebalance(bVar6,p_Var5,p_Var7,&p_Var1->_M_header);
  psVar2 = &(info->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void AddDependency(cmDependInformation* info, const std::string& file)
  {
    cmDependInformation* dependInfo =
      this->GetDependInformation(file, info->PathOnly);
    this->GenerateDependInformation(dependInfo);
    info->AddDependencies(dependInfo);
  }